

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O2

void gimage::gauss<float>
               (Image<float,_gimage::PixelTraits<float>_> *target,
               Image<float,_gimage::PixelTraits<float>_> *image,float s)

{
  float *pfVar1;
  long lVar2;
  long i;
  long lVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  long k;
  long lVar7;
  long i_00;
  int d;
  long lVar8;
  float fVar9;
  GaussKernel kernel;
  ImageFloat tmp;
  
  GaussKernel::GaussKernel(&kernel,s);
  Image<float,_gimage::PixelTraits<float>_>::Image(&tmp,image->height,1,1);
  pfVar1 = **tmp.img;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (target,image->width,image->height,(long)image->depth);
  for (lVar8 = 0; lVar8 < image->depth; lVar8 = lVar8 + 1) {
    pfVar5 = *target->img[lVar8];
    lVar7 = 0;
    while( true ) {
      lVar3 = image->height;
      if (lVar3 <= lVar7) break;
      for (lVar3 = 0; lVar3 < image->width; lVar3 = lVar3 + 1) {
        fVar9 = GaussKernel::convolveHorizontal<float>(&kernel,image,lVar3,lVar7,(int)lVar8);
        *pfVar5 = fVar9;
        pfVar5 = pfVar5 + 1;
      }
      lVar7 = lVar7 + 1;
    }
    lVar7 = 0;
    for (i_00 = 0; i_00 < image->width; i_00 = i_00 + 1) {
      for (lVar4 = 0; lVar4 < lVar3; lVar4 = lVar4 + 1) {
        fVar9 = GaussKernel::convolveVertical<float>(&kernel,target,i_00,lVar4,(int)lVar8);
        pfVar1[lVar4] = fVar9;
        lVar3 = image->height;
      }
      lVar4 = target->width;
      lVar2 = 0;
      if (0 < lVar3) {
        lVar2 = lVar3;
      }
      pfVar5 = (float *)((long)*target->img[lVar8] + lVar7);
      for (lVar6 = 0; lVar2 != lVar6; lVar6 = lVar6 + 1) {
        *pfVar5 = pfVar1[lVar6];
        pfVar5 = pfVar5 + lVar4;
      }
      lVar7 = lVar7 + 4;
    }
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(&tmp);
  GaussKernel::~GaussKernel(&kernel);
  return;
}

Assistant:

void gauss(Image<T> &target, const Image<T> &image, float s)
{
  GaussKernel kernel(s);

  ImageFloat tmp(image.getHeight(), 1, 1);
  float *p=tmp.getPtr(0, 0, 0);

  target.setSize(image.getWidth(), image.getHeight(), image.getDepth());

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal into target image

    T *tp=target.getPtr(0, 0, d);
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        *tp++=static_cast<T>(kernel.convolveHorizontal(image, i, k, d));
      }
    }

    // convolve vertically in place

    for (long i=0; i<image.getWidth(); i++)
    {
      for (long k=0; k<image.getHeight(); k++)
      {
        p[k]=kernel.convolveVertical(target, i, k, d);
      }

      tp=target.getPtr(i, 0, d);
      for (long k=0; k<image.getHeight(); k++)
      {
        *tp=static_cast<T>(p[k]);
        tp+=target.getWidth();
      }
    }
  }
}